

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_lantern_handling.hpp
# Opt level: O0

uint32_t PatchImproveLanternHandling::inject_func_and_words(ROM *rom)

{
  initializer_list<md::DataRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  size_t this;
  uint32_t uVar1;
  allocator<char> local_269;
  string local_268;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_248;
  allocator<md::DataRegister> local_221;
  DataRegister local_220;
  iterator local_210;
  size_type local_208;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_200;
  allocator<char> local_1e1;
  string local_1e0;
  DataRegister local_1c0;
  AddressRegister local_1b0;
  AddressInRegister local_1a0;
  DataRegister local_180;
  DataRegister local_170;
  DataRegister local_160;
  DataRegister local_150;
  AddressRegister local_140;
  AddressInRegister local_130;
  allocator<char> local_109;
  string local_108;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_e8;
  allocator<md::DataRegister> local_cd [13];
  DataRegister local_c0;
  iterator local_b0;
  size_type local_a8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_a0;
  undefined1 local_88 [8];
  Code func;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_88);
  md::DataRegister::DataRegister(&local_c0,'\x02');
  local_b0 = &local_c0;
  local_a8 = 1;
  std::allocator<md::DataRegister>::allocator(local_cd);
  __l_00._M_len = local_a8;
  __l_00._M_array = local_b0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_a0,__l_00,local_cd);
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector(&local_e8);
  md::Code::movem_to_stack((Code *)local_88,&local_a0,&local_e8);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_e8);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_a0);
  std::allocator<md::DataRegister>::~allocator(local_cd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"loop",&local_109);
  md::Code::label((Code *)local_88,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  md::AddressRegister::AddressRegister(&local_140,'\0');
  addr_<void>(&local_130,&local_140);
  md::DataRegister::DataRegister(&local_150,'\x02');
  md::Code::movew((Code *)local_88,&local_130.super_Param,(Param *)&local_150);
  md::DataRegister::DataRegister(&local_160,'\0');
  md::DataRegister::DataRegister(&local_170,'\x02');
  md::Code::andw((Code *)local_88,(Param *)&local_160,&local_170);
  md::DataRegister::DataRegister(&local_180,'\x02');
  md::AddressRegister::AddressRegister(&local_1b0,'\0');
  addr_postinc_<void>(&local_1a0,&local_1b0);
  md::Code::movew((Code *)local_88,(Param *)&local_180,&local_1a0.super_Param);
  md::DataRegister::DataRegister(&local_1c0,'\x01');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"loop",&local_1e1);
  md::Code::dbra((Code *)local_88,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  md::DataRegister::DataRegister(&local_220,'\x02');
  local_210 = &local_220;
  local_208 = 1;
  std::allocator<md::DataRegister>::allocator(&local_221);
  __l._M_len = local_208;
  __l._M_array = local_210;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_200,__l,&local_221);
  local_248.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector(&local_248);
  md::Code::movem_from_stack((Code *)local_88,&local_200,&local_248);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_248);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_200);
  std::allocator<md::DataRegister>::~allocator(&local_221);
  md::Code::rts((Code *)local_88);
  this = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"",&local_269);
  uVar1 = md::ROM::inject_code((ROM *)this,(Code *)local_88,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  md::Code::~Code((Code *)local_88);
  return uVar1;
}

Assistant:

static uint32_t inject_func_and_words(md::ROM& rom)
    {
        md::Code func;
        func.movem_to_stack({ reg_D2 }, {});
        {
            func.label("loop");
            {
                func.movew(addr_(reg_A0), reg_D2);
                func.andw(reg_D0, reg_D2);
                func.movew(reg_D2, addr_postinc_(reg_A0));
            }
            func.dbra(reg_D1, "loop");
        }
        func.movem_from_stack({ reg_D2 }, {});
        func.rts();
        return rom.inject_code(func);
    }